

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

void __thiscall NaNNUnit::SetInputScale(NaNNUnit *this,NaReal *yMin,NaReal *yMax)

{
  NaReal NVar1;
  undefined4 *puVar2;
  NaReal *pNVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  uint j;
  uint i;
  uint i_00;
  NaVector *in_stack_ffffffffffffffd0;
  uint local_20;
  uint local_1c;
  
  if ((in_RSI != 0) && (in_RDX != 0)) {
    for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x98); local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < *(uint *)(in_RDI + 0x94); local_20 = local_20 + 1) {
        NVar1 = *(NaReal *)(in_RSI + (ulong)local_20 * 8);
        i_00 = (uint)((ulong)NVar1 >> 0x20);
        pNVar3 = NaVector::operator[](in_stack_ffffffffffffffd0,i_00);
        *pNVar3 = NVar1;
        in_stack_ffffffffffffffd0 = *(NaVector **)(in_RDX + (ulong)local_20 * 8);
        pNVar3 = NaVector::operator[](in_stack_ffffffffffffffd0,i_00);
        *pNVar3 = (NaReal)in_stack_ffffffffffffffd0;
      }
    }
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

void
NaNNUnit::SetInputScale (const NaReal* yMin, const NaReal* yMax)
{
    if(NULL == yMin || NULL == yMax)
        throw(na_null_pointer);

    unsigned    i, j;
    for(i = 0; i < descr.nInputsRepeat; ++i){
        for(j = 0; j < descr.nInputsNumber; ++j){
            InputScaler.min[i * descr.nInputsNumber + j] = yMin[j];
            InputScaler.max[i * descr.nInputsNumber + j] = yMax[j];
        }
    }
}